

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void er_draw(vector<cv::Mat,_std::allocator<cv::Mat>_> *channels,
            vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
            *regions,vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *group,
            Mat *segmentation)

{
  pointer pVVar1;
  pointer pMVar2;
  long lVar3;
  int local_190;
  int local_18c;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_188;
  Mat *local_180;
  undefined4 local_178 [2];
  Mat *local_170;
  undefined8 local_168;
  undefined4 local_160 [2];
  pointer local_158;
  undefined8 local_150;
  ERStat er;
  Scalar_<double> local_90;
  Scalar_<double> local_70;
  Scalar_<double> local_50;
  
  local_188 = channels;
  local_180 = segmentation;
  for (lVar3 = 0;
      pVVar1 = (group->super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(group->
                                  super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 3);
      lVar3 = lVar3 + 1) {
    cv::text::ERStat::ERStat
              (&er,(ERStat *)
                   ((long)pVVar1[lVar3].super_Matx<int,_2,_1>.val[1] * 0xb8 +
                   *(long *)&(regions->
                             super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start
                             [pVVar1[lVar3].super_Matx<int,_2,_1>.val[0]].
                             super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>
                             ._M_impl.super__Vector_impl_data));
    if (er.parent != (ERStat *)0x0) {
      pVVar1 = (group->super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (local_188->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_150 = 0;
      local_158 = pMVar2 + (long)pVVar1[lVar3].super_Matx<int,_2,_1>.val[0] * 0x60;
      local_160[0] = 0x3010000;
      local_168 = 0;
      local_178[0] = 0x3010000;
      local_170 = local_180;
      local_190 = *(int *)(pMVar2 + (long)pVVar1[lVar3].super_Matx<int,_2,_1>.val[0] * 0x60 + 0xc);
      local_18c = er.pixel / local_190;
      local_190 = er.pixel % local_190;
      cv::Scalar_<double>::Scalar_(&local_50,255.0);
      cv::Scalar_<double>::Scalar_(&local_70,(double)er.level);
      cv::Scalar_<double>::Scalar_(&local_90,0.0);
      cv::floodFill(local_160,local_178,&local_190,&local_50,0,&local_70,&local_90,0x3ff04);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&er.crossings.super_shared_ptr<std::deque<int,_std::allocator<int>_>_>.
                super___shared_ptr<std::deque<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void er_draw(vector<Mat> &channels, vector<vector<ERStat> > &regions, vector<Vec2i> group, Mat& segmentation)
{
    for (int r=0; r<(int)group.size(); r++)
    {
        ERStat er = regions[group[r][0]][group[r][1]];
        if (er.parent != NULL) // deprecate the root region
        {
            int newMaskVal = 255;
            int flags = 4 + (newMaskVal << 8) + FLOODFILL_FIXED_RANGE + FLOODFILL_MASK_ONLY;
            floodFill(channels[group[r][0]],segmentation,Point(er.pixel%channels[group[r][0]].cols,er.pixel/channels[group[r][0]].cols),
                      Scalar(255),0,Scalar(er.level),Scalar(0),flags);
        }
    }
}